

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::NativeColorMappingCase::executeForConfig
          (NativeColorMappingCase *this,EGLDisplay display,EGLConfig config)

{
  glActiveTextureFunc *pp_Var1;
  bool bVar2;
  NativeType NVar3;
  TestLog *pTVar4;
  NativeDisplay *pNVar5;
  NativeColorMappingCase *pNVar6;
  bool bVar7;
  EGLint EVar8;
  deUint32 dVar9;
  int iVar10;
  Library *pLVar11;
  NativeWindowFactory *pNVar12;
  NativePixmapFactory *pNVar13;
  NotSupportedError *pNVar14;
  undefined4 extraout_var;
  NativePixmap *pNVar15;
  undefined4 extraout_var_00;
  undefined8 uVar16;
  undefined4 extraout_var_01;
  EGLSurface pvVar17;
  NativeWindow *window;
  undefined4 extraout_var_03;
  TestError *this_00;
  byte bVar18;
  Vec4 *pVVar19;
  long lVar20;
  deUint32 local_1c24;
  allocator<char> local_1c01;
  NativeColorMappingCase *local_1c00;
  UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> nativePixmap;
  UniqueSurface surface;
  TextureLevel local_1bc8;
  ScopedLogSection logSection;
  UniqueContext context;
  string configIdStr;
  Vec4 local_1b58;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  Functions gl;
  undefined4 extraout_var_02;
  
  local_1b58.m_data[0] = 0.0;
  local_1b58.m_data[1] = 0.0;
  local_1b58.m_data[2] = 0.0;
  local_1b58.m_data[3] = 1.0;
  local_1b48 = 0;
  uStack_1b40 = 0x3f8000003f800000;
  local_1b38 = 0x3f80000000000000;
  uStack_1b30 = 0x3f80000000000000;
  local_1b28 = 0x3f80000000000000;
  uStack_1b20 = 0x3f8000003f800000;
  local_1b18 = 0x3f800000;
  uStack_1b10 = 0x3f80000000000000;
  local_1b08 = 0x3f800000;
  uStack_1b00 = 0x3f8000003f800000;
  local_1af8 = 0x3f8000003f800000;
  uStack_1af0 = 0x3f80000000000000;
  local_1ae8 = 0x3f8000003f800000;
  uStack_1ae0 = 0x3f8000003f800000;
  local_1ad8 = 0;
  uStack_1ad0 = 0x3f80000000000000;
  local_1ac8 = 0;
  uStack_1ac0 = 0x3f8000003f000000;
  local_1ab8 = 0x3f00000000000000;
  uStack_1ab0 = 0x3f80000000000000;
  local_1aa8 = 0x3f00000000000000;
  uStack_1aa0 = 0x3f8000003f000000;
  local_1a98 = 0x3f000000;
  uStack_1a90 = 0x3f80000000000000;
  local_1a88 = 0x3f000000;
  uStack_1a80 = 0x3f8000003f000000;
  local_1a78 = 0x3f0000003f000000;
  uStack_1a70 = 0x3f80000000000000;
  local_1a68 = 0x3f0000003f000000;
  uStack_1a60 = 0x3f8000003f000000;
  pLVar11 = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  EVar8 = eglu::getConfigAttribInt(pLVar11,display,config,0x3028);
  gl.activeShaderProgram = (glActiveShaderProgramFunc)CONCAT44(gl.activeShaderProgram._4_4_,EVar8);
  de::toString<int>(&configIdStr,(int *)&gl);
  pTVar4 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1bc8,
                 "Config ID ",&configIdStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gl,(char *)local_1bc8.m_format,(allocator<char> *)&nativePixmap);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
                 "Config ID ",&configIdStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&surface,(char *)context.m_egl,&local_1c01);
  tcu::ScopedLogSection::ScopedLogSection(&logSection,pTVar4,(string *)&gl,(string *)&surface);
  std::__cxx11::string::~string((string *)&surface);
  std::__cxx11::string::~string((string *)&context);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::string::~string((string *)&local_1bc8);
  pTVar4 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  NVar3 = this->m_nativeType;
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_RED_SIZE: ");
  EVar8 = eglu::getConfigAttribInt(pLVar11,display,config,0x3024);
  std::ostream::operator<<(pp_Var1,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_GREEN_SIZE: ");
  EVar8 = eglu::getConfigAttribInt(pLVar11,display,config,0x3023);
  std::ostream::operator<<(pp_Var1,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_BLUE_SIZE: ");
  EVar8 = eglu::getConfigAttribInt(pLVar11,display,config,0x3022);
  std::ostream::operator<<(pp_Var1,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_ALPHA_SIZE: ");
  EVar8 = eglu::getConfigAttribInt(pLVar11,display,config,0x3021);
  std::ostream::operator<<(pp_Var1,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_DEPTH_SIZE: ");
  EVar8 = eglu::getConfigAttribInt(pLVar11,display,config,0x3025);
  std::ostream::operator<<(pp_Var1,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_STENCIL_SIZE: ");
  EVar8 = eglu::getConfigAttribInt(pLVar11,display,config,0x3026);
  std::ostream::operator<<(pp_Var1,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_SAMPLES: ");
  EVar8 = eglu::getConfigAttribInt(pLVar11,display,config,0x3031);
  std::ostream::operator<<(pp_Var1,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  if (NVar3 == NATIVETYPE_WINDOW) {
    pp_Var1 = &gl.activeTexture;
    gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
    std::operator<<((ostream *)pp_Var1,"Waiting ");
    std::ostream::operator<<(pp_Var1,0x50);
    std::operator<<((ostream *)pp_Var1,
                    "ms after eglSwapBuffers() and glFinish() for frame to become visible");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  }
  pNVar12 = eglu::selectNativeWindowFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if ((pNVar12->m_capabilities & CAPABILITY_READ_SCREEN_PIXELS) == 0) {
    pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar14,"Native window doesn\'t support readPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
               ,0x1e8);
    __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar13 = eglu::selectNativePixmapFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if (this->m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) {
    if ((~*(uint *)(pNVar13 + 0x48) & 5) != 0) {
      pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar14,"Native pixmap doesn\'t support readPixels() or legacy create surface",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                 ,0x1ff);
      goto LAB_00215a34;
    }
  }
  else if ((this->m_nativeType == NATIVETYPE_PIXMAP) && (((byte)pNVar13[0x48] & 4) == 0)) {
    pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar14,"Native pixmap doesn\'t support readPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
               ,0x1f9);
LAB_00215a34:
    __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x200003098;
  gl.activeTexture._0_4_ = 0x3038;
  (**pLVar11->_vptr_Library)(pLVar11,0x30a0);
  dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
  eglu::checkError(dVar9,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                   ,0x4f);
  iVar10 = (*pLVar11->_vptr_Library[6])(pLVar11,display,config,0);
  dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
  eglu::checkError(dVar9,"eglCreateContext() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                   ,0x52);
  if ((EGLContext)CONCAT44(extraout_var,iVar10) == (EGLContext)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"context",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
               ,0x53);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  eglu::UniqueContext::UniqueContext
            (&context,pLVar11,display,(EGLContext)CONCAT44(extraout_var,iVar10));
  glw::Functions::Functions(&gl);
  EglTestContext::initGLFunctions
            ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx,&gl,(ApiType)0x2);
  NVar3 = this->m_nativeType;
  if (NVar3 == NATIVETYPE_WINDOW) {
    local_1bc8.m_format.order = 0x80;
    local_1bc8.m_format.type = 0x80;
    local_1bc8.m_size.m_data[0] = 1;
    iVar10 = (*(pNVar12->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                       (pNVar12,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                m_nativeDisplay).
                                super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                .m_data.ptr,display,config);
    window = (NativeWindow *)CONCAT44(extraout_var_02,iVar10);
    pTVar4 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
             ->m_log;
    pNVar5 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    bVar2 = this->m_render;
    local_1c00 = this;
    nativePixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.
    m_data.ptr = (NativePixmap *)window;
    iVar10 = (*pNVar5->_vptr_NativeDisplay[2])(pNVar5);
    pLVar11 = (Library *)CONCAT44(extraout_var_03,iVar10);
    pvVar17 = eglu::createWindowSurface(pNVar5,window,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface(&surface,pLVar11,display,pvVar17);
    tcu::TextureLevel::TextureLevel(&local_1bc8);
    (*pLVar11->_vptr_Library[0x27])
              (pLVar11,display,surface.m_surface,surface.m_surface,context.m_context);
    dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
    eglu::checkError(dVar9,"makeCurrent(display, *surface, *surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x14d);
    local_1c24 = 0;
    if (bVar2 != false) {
      local_1c24 = createGLES2Program(&gl,pTVar4);
    }
    bVar18 = 1;
    for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 0x10) {
      pVVar19 = (Vec4 *)((long)local_1b58.m_data + lVar20);
      if (bVar2 == false) {
        anon_unknown_0::clear(&gl,pVVar19);
      }
      else {
        render(&gl,local_1c24,pVVar19);
      }
      (*pLVar11->_vptr_Library[0x31])(pLVar11,display,surface.m_surface);
      dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
      eglu::checkError(dVar9,"swapBuffers(display, *surface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x159);
      (*pLVar11->_vptr_Library[0x36])(pLVar11);
      dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
      eglu::checkError(dVar9,"waitClient()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x15a);
      deSleep(0x50);
      (*window->_vptr_NativeWindow[8])(window,&local_1bc8);
      bVar7 = validate(pTVar4,pLVar11,display,config,&local_1bc8,pVVar19);
      bVar18 = bVar18 & bVar7;
    }
    (*pLVar11->_vptr_Library[0x27])(pLVar11,display,0,0,0);
    dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
    eglu::checkError(dVar9,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x162);
    tcu::TextureLevel::~TextureLevel(&local_1bc8);
    eglu::UniqueSurface::~UniqueSurface(&surface);
    if (bVar18 == 0) {
      tcu::TestContext::setTestResult
                ((local_1c00->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
    de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
    ~UniqueBase((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                &nativePixmap);
  }
  else {
    if (NVar3 == NATIVETYPE_PIXMAP) {
      pNVar15 = (NativePixmap *)
                (**(code **)(*(long *)pNVar13 + 0x20))
                          (pNVar13,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                   m_nativeDisplay).
                                   super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                   .m_data.ptr,display,config,0,0x80,0x80);
      pTVar4 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      pNVar5 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      bVar2 = this->m_render;
      local_1c00 = this;
      nativePixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.
      m_data.ptr = pNVar15;
      iVar10 = (*pNVar5->_vptr_NativeDisplay[2])(pNVar5);
      pLVar11 = (Library *)CONCAT44(extraout_var_01,iVar10);
      pvVar17 = eglu::createPixmapSurface(pNVar5,pNVar15,display,config,(EGLAttrib *)0x0);
      eglu::UniqueSurface::UniqueSurface(&surface,pLVar11,display,pvVar17);
      tcu::TextureLevel::TextureLevel(&local_1bc8);
      (*pLVar11->_vptr_Library[0x27])
                (pLVar11,display,surface.m_surface,surface.m_surface,context.m_context);
      dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
      eglu::checkError(dVar9,"makeCurrent(display, *surface, *surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x178);
      local_1c24 = 0;
      if (bVar2 != false) {
        local_1c24 = createGLES2Program(&gl,pTVar4);
      }
      bVar18 = 1;
      for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 0x10) {
        pVVar19 = (Vec4 *)((long)local_1b58.m_data + lVar20);
        if (bVar2 == false) {
          anon_unknown_0::clear(&gl,pVVar19);
        }
        else {
          render(&gl,local_1c24,pVVar19);
        }
        (*pLVar11->_vptr_Library[0x36])(pLVar11);
        dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
        eglu::checkError(dVar9,"waitClient()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                         ,0x184);
        (**(code **)(*(long *)pNVar15 + 0x20))(pNVar15,&local_1bc8);
        bVar7 = validate(pTVar4,pLVar11,display,config,&local_1bc8,pVVar19);
        bVar18 = bVar18 & bVar7;
      }
      (*pLVar11->_vptr_Library[0x27])(pLVar11,display,0,0,0);
      dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
      eglu::checkError(dVar9,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x18b);
      tcu::TextureLevel::~TextureLevel(&local_1bc8);
      eglu::UniqueSurface::~UniqueSurface(&surface);
      if (bVar18 == 0) {
        tcu::TestContext::setTestResult
                  ((local_1c00->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
      }
    }
    else {
      if (NVar3 != NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) goto LAB_00215951;
      pNVar15 = (NativePixmap *)
                (**(code **)(*(long *)pNVar13 + 0x20))
                          (pNVar13,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                   m_nativeDisplay).
                                   super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                   .m_data.ptr,display,config,0,0x80,0x80);
      pTVar4 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      bVar2 = this->m_render;
      nativePixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.
      m_data.ptr = pNVar15;
      iVar10 = (*pLVar11->_vptr_Library[10])(pLVar11,display,config,0);
      eglu::UniqueSurface::UniqueSurface
                (&surface,pLVar11,display,(EGLSurface)CONCAT44(extraout_var_00,iVar10));
      tcu::TextureLevel::TextureLevel(&local_1bc8);
      (*pLVar11->_vptr_Library[0x27])
                (pLVar11,display,surface.m_surface,surface.m_surface,context.m_context);
      dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
      eglu::checkError(dVar9,"makeCurrent(display, *surface, *surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x1a0);
      local_1c24 = 0;
      if (bVar2 != false) {
        local_1c24 = createGLES2Program(&gl,pTVar4);
      }
      bVar18 = 1;
      local_1c00 = this;
      for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 0x10) {
        pVVar19 = (Vec4 *)((long)local_1b58.m_data + lVar20);
        if (bVar2 == false) {
          anon_unknown_0::clear(&gl,pVVar19);
        }
        else {
          render(&gl,local_1c24,pVVar19);
        }
        pvVar17 = surface.m_surface;
        uVar16 = (**(code **)(*(long *)pNVar15 + 0x10))(pNVar15);
        (*pLVar11->_vptr_Library[5])(pLVar11,display,pvVar17,uVar16);
        dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
        eglu::checkError(dVar9,"copyBuffers(display, *surface, nativePixmap.getLegacyNative())",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                         ,0x1ac);
        (*pLVar11->_vptr_Library[0x36])(pLVar11);
        dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
        eglu::checkError(dVar9,"waitClient()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                         ,0x1ad);
        (**(code **)(*(long *)pNVar15 + 0x20))(pNVar15,&local_1bc8);
        bVar7 = validate(pTVar4,pLVar11,display,config,&local_1bc8,pVVar19);
        bVar18 = bVar18 & bVar7;
      }
      (*pLVar11->_vptr_Library[0x27])(pLVar11,display,0,0,0);
      pNVar6 = local_1c00;
      dVar9 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
      eglu::checkError(dVar9,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x1b4);
      tcu::TextureLevel::~TextureLevel(&local_1bc8);
      eglu::UniqueSurface::~UniqueSurface(&surface);
      if (bVar18 == 0) {
        tcu::TestContext::setTestResult
                  ((pNVar6->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
      }
    }
    de::details::UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
    ~UniqueBase(&nativePixmap.
                 super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>);
  }
LAB_00215951:
  eglu::UniqueContext::~UniqueContext(&context);
  tcu::ScopedLogSection::~ScopedLogSection(&logSection);
  std::__cxx11::string::~string((string *)&configIdStr);
  return;
}

Assistant:

void NativeColorMappingCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const int width		= 128;
	const int height	= 128;

	const tcu::Vec4 colors[] =
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),

		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 0.5f, 1.0f),
		tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.5f, 0.5f, 1.0f),
		tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f),
		tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f)
	};

	const Library&						egl				= m_eglTestCtx.getLibrary();
	const string						configIdStr		(de::toString(eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID)));
	tcu::ScopedLogSection				logSection		(m_testCtx.getLog(), ("Config ID " + configIdStr).c_str(), ("Config ID " + configIdStr).c_str());
	const int							waitFrames		= 5;
	const eglu::NativeWindowFactory*	windowFactory;
	const eglu::NativePixmapFactory*	pixmapFactory;

	logConfigInfo(m_testCtx.getLog(), egl, display, config, m_nativeType, waitFrames);

	try
	{
		windowFactory = &eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if ((windowFactory->getCapabilities() & eglu::NativeWindow::CAPABILITY_READ_SCREEN_PIXELS) == 0)
			TCU_THROW(NotSupportedError, "Native window doesn't support readPixels()");
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_WINDOW)
			throw;
		else
			windowFactory = DE_NULL;
	}

	try
	{
		pixmapFactory = &eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if (m_nativeType == NATIVETYPE_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels()");
		}
		else if (m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0 ||
				(pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels() or legacy create surface");
		}
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_PIXMAP || m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
			throw;
		else
			pixmapFactory = DE_NULL;
	}

	DE_ASSERT(m_nativeType != NATIVETYPE_WINDOW || windowFactory);
	DE_ASSERT((m_nativeType != NATIVETYPE_PIXMAP && m_nativeType != NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) || pixmapFactory);

	eglu::UniqueContext		context		(egl, display, createGLES2Context(egl, display, config));
	glw::Functions			gl;

	m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));

	switch (m_nativeType)
	{
		case NATIVETYPE_WINDOW:
		{
			de::UniquePtr<eglu::NativeWindow>	nativeWindow	(windowFactory->createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::WindowParams::VISIBILITY_VISIBLE)));

			if (!testNativeWindow(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativeWindow, display, *context, config, gl, m_render, waitFrames, DE_LENGTH_OF_ARRAY(colors), colors))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");
			break;
		}

		case NATIVETYPE_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmap(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativePixmap, display, *context, config, gl, m_render, DE_LENGTH_OF_ARRAY(colors), colors))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");
			break;
		}

		case NATIVETYPE_PBUFFER_COPY_TO_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmapCopy(m_testCtx.getLog(), egl, *nativePixmap, display, *context, config, gl, m_render, DE_LENGTH_OF_ARRAY(colors), colors))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}
}